

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::SimpleTypeHandler<1UL>::SimpleTypeHandler
          (SimpleTypeHandler<1UL> *this,SimpleTypeHandler<1UL> *typeHandler,bool unused)

{
  PropertyRecord *pPVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  anon_union_8_2_5e5949cc_for_SimplePropertyDescriptor_1 *paVar5;
  long lVar6;
  Type *addr;
  
  DynamicTypeHandler::DynamicTypeHandler
            (&this->super_DynamicTypeHandler,1,
             (typeHandler->super_DynamicTypeHandler).inlineSlotCapacity,
             (typeHandler->super_DynamicTypeHandler).offsetOfInlineSlots,'\x01');
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01540968
  ;
  this->propertyCount = typeHandler->propertyCount;
  this->descriptors[0].Id.ptr = (PropertyRecord *)0x0;
  this->descriptors[0].field_1.preventFalseReference = (Type)0x0;
  this->descriptors[0].field_1.Attributes = '\a';
  if (((typeHandler->super_DynamicTypeHandler).propertyTypes & 0x40) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x11,"(typeHandler->GetIsInlineSlotCapacityLocked())",
                                "typeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  if (0 < this->propertyCount) {
    addr = this->descriptors;
    paVar5 = &typeHandler->descriptors[0].field_1;
    lVar6 = 0;
    do {
      pPVar1 = (((Type *)(paVar5 + -1))->Id).ptr;
      Memory::Recycler::WBSetBit((char *)addr);
      (addr->Id).ptr = pPVar1;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      addr->field_1 = *paVar5;
      lVar6 = lVar6 + 1;
      addr = addr + 1;
      paVar5 = paVar5 + 2;
    } while (lVar6 < this->propertyCount);
  }
  return;
}

Assistant:

SimpleTypeHandler<size>::SimpleTypeHandler(SimpleTypeHandler<size> * typeHandler, bool unused)
        : DynamicTypeHandler(sizeof(descriptors) / sizeof(SimplePropertyDescriptor),
            typeHandler->GetInlineSlotCapacity(), typeHandler->GetOffsetOfInlineSlots()), propertyCount(typeHandler->propertyCount)
    {
        Assert(typeHandler->GetIsInlineSlotCapacityLocked());
        SetIsInlineSlotCapacityLocked();
        for (int i = 0; i < propertyCount; i++)
        {
            descriptors[i] = typeHandler->descriptors[i];
        }
    }